

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler.cc
# Opt level: O2

void __thiscall
google::anon_unknown_0::MinimalFormatter::AppendUint64
          (MinimalFormatter *this,uint64 number,uint radix)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  byte bVar4;
  byte bVar5;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar3 = CONCAT44(0,radix);
  uVar7 = 0;
  do {
    pcVar6 = this->cursor_;
    uVar8 = (ulong)uVar7;
    if (this->end_ <= pcVar6 + uVar8) goto LAB_0011b2fb;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar3;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = number;
    bVar4 = SUB161(auVar2 % auVar1,0);
    bVar5 = bVar4 + 0x57;
    if (SUB168(auVar2 % auVar1,0) < 10) {
      bVar5 = bVar4 | 0x30;
    }
    pcVar6[uVar8] = bVar5;
    uVar7 = uVar7 + 1;
    bVar9 = uVar3 <= number;
    number = number / uVar3;
  } while (bVar9);
  pcVar6 = this->cursor_;
  uVar8 = (ulong)uVar7;
LAB_0011b2fb:
  std::__reverse<char*>(pcVar6,pcVar6 + uVar8);
  this->cursor_ = this->cursor_ + uVar8;
  return;
}

Assistant:

void AppendUint64(uint64 number, unsigned radix) {
    unsigned i = 0;
    while (cursor_ + i < end_) {
      const uint64 tmp = number % radix;
      number /= radix;
      cursor_[i] = static_cast<char>(tmp < 10 ? '0' + tmp : 'a' + tmp - 10);
      ++i;
      if (number == 0) {
        break;
      }
    }
    // Reverse the bytes written.
    std::reverse(cursor_, cursor_ + i);
    cursor_ += i;
  }